

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitap.hpp
# Opt level: O2

iterator_range<std::_Fwd_list_const_iterator<int>_> __thiscall
burst::algorithm::
bitap<int,std::bitset<32ul>,std::unordered_map<int,std::bitset<32ul>,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>
::find_first<std::_Fwd_list_const_iterator<int>>
          (bitap<int,std::bitset<32ul>,std::unordered_map<int,std::bitset<32ul>,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>
           *this,_Fwd_list_const_iterator<int> corpus_begin,_Fwd_list_const_iterator<int> corpus_end
          ,bitmask_type *hint)

{
  _Fwd_list_const_iterator<int> corpus_current;
  iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
  iVar1;
  
  corpus_current =
       dummy_search<std::_Fwd_list_const_iterator<int>>(this,corpus_begin,corpus_end,hint);
  iVar1 = (iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
           )active_search<std::_Fwd_list_const_iterator<int>>
                      (this,corpus_begin,corpus_current,corpus_end,hint);
  return (iterator_range<std::_Fwd_list_const_iterator<int>_>)iVar1;
}

Assistant:

boost::iterator_range<ForwardIterator>
                find_first
                (
                    ForwardIterator corpus_begin,
                    ForwardIterator corpus_end,
                    bitmask_type & hint
                ) const
            {
                return
                    active_search
                    (
                        corpus_begin,
                        dummy_search(corpus_begin, corpus_end, hint),
                        corpus_end,
                        hint
                    );
            }